

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

array<int,_8UL> * dgrminer::flipAdjacencyInfo(array<int,_8UL> *adjacencyinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  array<int,_8UL> *in_RDI;
  
  *(undefined8 *)in_RDI->_M_elems = *(undefined8 *)(adjacencyinfo->_M_elems + 5);
  iVar3 = adjacencyinfo->_M_elems[2];
  if (iVar3 == 1) {
    iVar3 = 2;
  }
  else if (iVar3 == 2) {
    iVar3 = 1;
  }
  in_RDI->_M_elems[2] = iVar3;
  iVar3 = adjacencyinfo->_M_elems[0];
  iVar1 = adjacencyinfo->_M_elems[1];
  iVar2 = adjacencyinfo->_M_elems[4];
  in_RDI->_M_elems[3] = adjacencyinfo->_M_elems[3];
  in_RDI->_M_elems[4] = iVar2;
  in_RDI->_M_elems[5] = iVar3;
  in_RDI->_M_elems[6] = iVar1;
  in_RDI->_M_elems[7] = adjacencyinfo->_M_elems[7];
  return in_RDI;
}

Assistant:

std::array<int, 8> flipAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {
        // flips src-label with dst-label, src-changetime with dst-changetime, and direction
        std::array<int, 8> newadjacencyinfo = {adjacencyinfo[5], adjacencyinfo[6],
                                               flipDirection(adjacencyinfo[2]), adjacencyinfo[3], adjacencyinfo[4],
                                               adjacencyinfo[0], adjacencyinfo[1], adjacencyinfo[7]};
        return newadjacencyinfo;
    }